

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmSourceFileSetName(void *arg,char *name,char *dir,int numSourceExtensions,
                        char **sourceExtensions,int numHeaderExtensions,char **headerExtensions)

{
  string *psVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pbVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  string *ext;
  pointer pbVar9;
  string *ext_2;
  string *psVar10;
  string hname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceExts;
  string pathname;
  ostringstream e;
  allocator<char> local_251;
  void *local_250;
  string local_248;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (*arg == 0) {
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_250 = arg;
    if (0 < numSourceExtensions) {
      uVar8 = (ulong)(uint)numSourceExtensions;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                   sourceExtensions);
        sourceExtensions = sourceExtensions + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    if (0 < numHeaderExtensions) {
      uVar8 = (ulong)(uint)numHeaderExtensions;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                   headerExtensions);
        headerExtensions = headerExtensions + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    psVar10 = (string *)((long)local_250 + 8);
    pcVar3 = *(char **)((long)local_250 + 0x10);
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,name,(allocator<char> *)&local_228);
    cmsys::SystemTools::CollapseFullPath(&local_1d0,(string *)local_1a8,dir);
    pcVar2 = local_1a8 + 0x10;
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_1d0._M_dataplus._M_p,
               local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
    bVar5 = cmsys::SystemTools::FileExists(&local_228);
    pbVar4 = local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,name,&local_251);
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_248);
      std::__cxx11::string::operator=(psVar10,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)((long)local_250 + 0x10) != 0) {
        std::__cxx11::string::append((char *)psVar10);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,name,&local_251);
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_1a8,&local_248);
      std::__cxx11::string::_M_append((char *)psVar10,local_1a8._0_8_);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      lVar6 = std::__cxx11::string::rfind((char)&local_228,0x2e);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_228);
        std::__cxx11::string::operator=((string *)((long)local_250 + 0x28),(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        bVar5 = cmsys::SystemTools::FileIsFullPath(name);
        if (bVar5) {
          lVar6 = std::__cxx11::string::rfind((char)&local_228,0x2f);
          if (lVar6 != -1) {
            std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_228);
            std::__cxx11::string::operator=(psVar10,(string *)local_1a8);
            if ((pointer)local_1a8._0_8_ != pcVar2) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)((long)local_250 + 0x48));
    }
    else {
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar10 = (string *)((long)local_250 + 0x28);
        psVar1 = (string *)((long)local_250 + 0x48);
        pbVar9 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::string::_M_assign((string *)&local_228);
          std::__cxx11::string::append((char *)&local_228);
          std::__cxx11::string::_M_append((char *)&local_228,(ulong)(pbVar9->_M_dataplus)._M_p);
          bVar5 = cmsys::SystemTools::FileExists(&local_228);
          if (bVar5) {
            std::__cxx11::string::_M_assign(psVar10);
            std::__cxx11::string::_M_assign(psVar1);
            if (bVar5) goto LAB_002ea6a1;
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar4);
      }
      pbVar4 = local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_1b0 = (string *)((long)local_250 + 0x28);
        psVar10 = (string *)((long)local_250 + 0x48);
        pbVar9 = local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::string::_M_assign((string *)&local_228);
          std::__cxx11::string::append((char *)&local_228);
          std::__cxx11::string::_M_append((char *)&local_228,(ulong)(pbVar9->_M_dataplus)._M_p);
          bVar5 = cmsys::SystemTools::FileExists(&local_228);
          if (bVar5) {
            std::__cxx11::string::_M_assign(local_1b0);
            std::__cxx11::string::_M_assign(psVar10);
            if (bVar5) goto LAB_002ea6a1;
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar4);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Cannot find source file \"",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nTried extensions",0x12);
      pbVar4 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar9 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar4);
      }
      pbVar4 = local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar9 = local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar4);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
LAB_002ea6a1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
  }
  return;
}

Assistant:

void CCONV cmSourceFileSetName(void* arg, const char* name, const char* dir,
                               int numSourceExtensions,
                               const char** sourceExtensions,
                               int numHeaderExtensions,
                               const char** headerExtensions)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }
  std::vector<std::string> sourceExts;
  std::vector<std::string> headerExts;
  int i;
  for (i = 0; i < numSourceExtensions; ++i) {
    sourceExts.emplace_back(sourceExtensions[i]);
  }
  for (i = 0; i < numHeaderExtensions; ++i) {
    headerExts.emplace_back(headerExtensions[i]);
  }

  // Save the original name given.
  sf->SourceName = name;

  // Convert the name to a full path in case the given name is a
  // relative path.
  std::string pathname = cmSystemTools::CollapseFullPath(name, dir);

  // First try and see whether the listed file can be found
  // as is without extensions added on.
  std::string hname = pathname;
  if (cmSystemTools::FileExists(hname)) {
    sf->SourceName = cmSystemTools::GetFilenamePath(name);
    if (!sf->SourceName.empty()) {
      sf->SourceName += "/";
    }
    sf->SourceName += cmSystemTools::GetFilenameWithoutLastExtension(name);
    std::string::size_type pos = hname.rfind('.');
    if (pos != std::string::npos) {
      sf->SourceExtension = hname.substr(pos + 1, hname.size() - pos);
      if (cmSystemTools::FileIsFullPath(name)) {
        std::string::size_type pos2 = hname.rfind('/');
        if (pos2 != std::string::npos) {
          sf->SourceName = hname.substr(pos2 + 1, pos - pos2 - 1);
        }
      }
    }

    sf->FullPath = hname;
    return;
  }

  // Next, try the various source extensions
  for (std::string const& ext : sourceExts) {
    hname = pathname;
    hname += ".";
    hname += ext;
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  // Finally, try the various header extensions
  for (std::string const& ext : headerExts) {
    hname = pathname;
    hname += ".";
    hname += ext;
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  std::ostringstream e;
  e << "Cannot find source file \"" << pathname << "\"";
  e << "\n\nTried extensions";
  for (std::string const& ext : sourceExts) {
    e << " ." << ext;
  }
  for (std::string const& ext : headerExts) {
    e << " ." << ext;
  }
  cmSystemTools::Error(e.str());
}